

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLD2DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint RegNo;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  DecodeStatus DVar7;
  uint Rd;
  uint size;
  uint align;
  uint Rm;
  uint Rn;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Insn_local;
  MCInst *Inst_local;
  
  Rm = 3;
  _Rn = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Insn;
  pMStack_18 = Inst;
  uVar2 = fieldFromInstruction_4(Insn,0xc,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0x16,1);
  RegNo = uVar2 | uVar3 << 4;
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,0x10,4);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,0,4);
  uVar4 = fieldFromInstruction_4(Address_local._4_4_,4,1);
  uVar5 = fieldFromInstruction_4(Address_local._4_4_,6,2);
  uVar6 = MCInst_getOpcode(pMStack_18);
  if (uVar6 - 0x39d < 3) {
LAB_0016b62d:
    DVar7 = DecodeDPairRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&Rm,DVar7);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  else {
    if (2 < uVar6 - 0x3a0) {
      if (uVar6 - 0x3a3 < 3) goto LAB_0016b62d;
      if (2 < uVar6 - 0x3a6) {
        if (uVar6 - 0x3a9 < 3) goto LAB_0016b62d;
        if (2 < uVar6 - 0x3ac) {
          DVar7 = DecodeDPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
          _Var1 = Check(&Rm,DVar7);
          if (!_Var1) {
            return MCDisassembler_Fail;
          }
          goto LAB_0016b6c0;
        }
      }
    }
    DVar7 = DecodeDPairSpacedRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rn);
    _Var1 = Check(&Rm,DVar7);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
LAB_0016b6c0:
  if (uVar3 != 0xf) {
    MCOperand_CreateImm0(pMStack_18,0);
  }
  DVar7 = DecodeGPRRegisterClass(pMStack_18,uVar2,(uint64_t)Decoder_local,_Rn);
  _Var1 = Check(&Rm,DVar7);
  if (_Var1) {
    MCOperand_CreateImm0(pMStack_18,(ulong)((1 << ((byte)uVar5 & 0x1f)) * uVar4 * 2));
    if ((uVar3 != 0xd) && (uVar3 != 0xf)) {
      DVar7 = DecodeGPRRegisterClass(pMStack_18,uVar3,(uint64_t)Decoder_local,_Rn);
      _Var1 = Check(&Rm,DVar7);
      if (!_Var1) {
        return MCDisassembler_Fail;
      }
    }
    Inst_local._4_4_ = Rm;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeVLD2DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, align, size;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	align = fieldFromInstruction_4(Insn, 4, 1);
	size = 1 << fieldFromInstruction_4(Insn, 6, 2);
	align *= 2*size;

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VLD2DUPd16: case ARM_VLD2DUPd32: case ARM_VLD2DUPd8:
		case ARM_VLD2DUPd16wb_fixed: case ARM_VLD2DUPd16wb_register:
		case ARM_VLD2DUPd32wb_fixed: case ARM_VLD2DUPd32wb_register:
		case ARM_VLD2DUPd8wb_fixed: case ARM_VLD2DUPd8wb_register:
			if (!Check(&S, DecodeDPairRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VLD2DUPd16x2: case ARM_VLD2DUPd32x2: case ARM_VLD2DUPd8x2:
		case ARM_VLD2DUPd16x2wb_fixed: case ARM_VLD2DUPd16x2wb_register:
		case ARM_VLD2DUPd32x2wb_fixed: case ARM_VLD2DUPd32x2wb_register:
		case ARM_VLD2DUPd8x2wb_fixed: case ARM_VLD2DUPd8x2wb_register:
			if (!Check(&S, DecodeDPairSpacedRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
	}

	if (Rm != 0xF)
		MCOperand_CreateImm0(Inst, 0);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);

	if (Rm != 0xD && Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}